

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bind_drop.cpp
# Opt level: O1

BoundStatement * __thiscall
duckdb::Binder::Bind(BoundStatement *__return_storage_ptr__,Binder *this,DropStatement *stmt)

{
  byte bVar1;
  CatalogType catalog_type_p;
  ClientContext *pCVar2;
  _Head_base<0UL,_duckdb::DropInfo_*,_false> _Var3;
  _Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_> _Var4;
  pointer pcVar5;
  int iVar6;
  StatementProperties *this_00;
  pointer pDVar7;
  pointer pDVar8;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  Catalog *catalog_00;
  _Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_> this_01
  ;
  CatalogException *this_02;
  BinderException *this_03;
  CatalogType type;
  unique_ptr<duckdb::DropInfo,_std::default_delete<duckdb::DropInfo>,_true> *this_04;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  initializer_list<duckdb::LogicalType> __l_00;
  optional_ptr<duckdb::CatalogEntry,_true> entry;
  optional_ptr<duckdb::Catalog,_true> catalog;
  EntryLookupInfo entry_lookup;
  optional_ptr<duckdb::CatalogEntry,_true> local_e0;
  LogicalType local_d8;
  undefined1 local_b8 [32];
  undefined1 local_98 [40];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50;
  
  (__return_storage_ptr__->names).
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->names).
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->types).
  super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->types).
  super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->plan).
  super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>._M_t.
  super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>._M_t
  .super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>.
  super__Head_base<0UL,_duckdb::LogicalOperator_*,_false> =
       (_Head_base<0UL,_duckdb::LogicalOperator_*,_false>)0x0;
  (__return_storage_ptr__->types).
  super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->names).
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this_00 = GetStatementProperties(this);
  this_04 = &stmt->info;
  pDVar7 = unique_ptr<duckdb::DropInfo,_std::default_delete<duckdb::DropInfo>,_true>::operator->
                     (this_04);
  bVar1 = (pDVar7->super_ParseInfo).field_0x9;
  if (bVar1 < 0x20) {
    if ((0xc000015aU >> (bVar1 & 0x1f) & 1) != 0) {
      pDVar7 = unique_ptr<duckdb::DropInfo,_std::default_delete<duckdb::DropInfo>,_true>::operator->
                         (this_04);
      pDVar8 = unique_ptr<duckdb::DropInfo,_std::default_delete<duckdb::DropInfo>,_true>::operator->
                         (this_04);
      BindSchemaOrCatalog(this->context,&pDVar7->catalog,&pDVar8->schema);
      pCVar2 = this->context;
      pDVar7 = unique_ptr<duckdb::DropInfo,_std::default_delete<duckdb::DropInfo>,_true>::operator->
                         (this_04);
      local_d8._0_8_ = Catalog::GetCatalogEntry(pCVar2,&pDVar7->catalog);
      if ((Catalog *)local_d8._0_8_ != (Catalog *)0x0) {
        optional_ptr<duckdb::Catalog,_true>::CheckValid
                  ((optional_ptr<duckdb::Catalog,_true> *)&local_d8);
        StatementProperties::RegisterDBRead(this_00,(Catalog *)local_d8._0_8_,this->context);
      }
      pDVar7 = unique_ptr<duckdb::DropInfo,_std::default_delete<duckdb::DropInfo>,_true>::operator->
                         (this_04);
      catalog_type_p = (pDVar7->super_ParseInfo).field_0x9;
      pDVar7 = unique_ptr<duckdb::DropInfo,_std::default_delete<duckdb::DropInfo>,_true>::operator->
                         (this_04);
      EntryLookupInfo::EntryLookupInfo
                ((EntryLookupInfo *)local_b8,catalog_type_p,&pDVar7->name,
                 (QueryErrorContext)0xffffffffffffffff);
      pCVar2 = this->context;
      pDVar7 = unique_ptr<duckdb::DropInfo,_std::default_delete<duckdb::DropInfo>,_true>::operator->
                         (this_04);
      pDVar8 = unique_ptr<duckdb::DropInfo,_std::default_delete<duckdb::DropInfo>,_true>::operator->
                         (this_04);
      local_e0 = Catalog::GetEntry(pCVar2,&pDVar7->catalog,&pDVar8->schema,
                                   (EntryLookupInfo *)local_b8,RETURN_NULL);
      if (local_e0.ptr != (CatalogEntry *)0x0) {
        optional_ptr<duckdb::CatalogEntry,_true>::CheckValid(&local_e0);
        if ((local_e0.ptr)->internal == true) {
          this_02 = (CatalogException *)__cxa_allocate_exception(0x10);
          local_98._0_8_ = local_98 + 0x10;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_98,"Cannot drop internal catalog entry \"%s\"!","");
          optional_ptr<duckdb::CatalogEntry,_true>::CheckValid(&local_e0);
          local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
          pcVar5 = ((local_e0.ptr)->name)._M_dataplus._M_p;
          ::std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_70,pcVar5,pcVar5 + ((local_e0.ptr)->name)._M_string_length);
          CatalogException::CatalogException<std::__cxx11::string>
                    (this_02,(string *)local_98,&local_70);
          __cxa_throw(this_02,&CatalogException::typeinfo,::std::runtime_error::~runtime_error);
        }
        optional_ptr<duckdb::CatalogEntry,_true>::CheckValid(&local_e0);
        iVar6 = (*(local_e0.ptr)->_vptr_CatalogEntry[0xb])();
        Catalog::GetName_abi_cxx11_((Catalog *)CONCAT44(extraout_var,iVar6));
        pDVar7 = unique_ptr<duckdb::DropInfo,_std::default_delete<duckdb::DropInfo>,_true>::
                 operator->(this_04);
        ::std::__cxx11::string::_M_assign((string *)&pDVar7->catalog);
        optional_ptr<duckdb::CatalogEntry,_true>::CheckValid(&local_e0);
        if ((local_e0.ptr)->temporary == false) {
          optional_ptr<duckdb::CatalogEntry,_true>::CheckValid(&local_e0);
          iVar6 = (*(local_e0.ptr)->_vptr_CatalogEntry[0xb])();
          StatementProperties::RegisterDBModify
                    (this_00,(Catalog *)CONCAT44(extraout_var_00,iVar6),this->context);
        }
        optional_ptr<duckdb::CatalogEntry,_true>::CheckValid(&local_e0);
        (*(local_e0.ptr)->_vptr_CatalogEntry[0xd])();
        pDVar7 = unique_ptr<duckdb::DropInfo,_std::default_delete<duckdb::DropInfo>,_true>::
                 operator->(this_04);
        ::std::__cxx11::string::_M_assign((string *)&pDVar7->schema);
      }
      goto LAB_006f5db7;
    }
    if (bVar1 == 2) {
      pCVar2 = this->context;
      pDVar7 = unique_ptr<duckdb::DropInfo,_std::default_delete<duckdb::DropInfo>,_true>::operator->
                         (this_04);
      catalog_00 = Catalog::GetCatalog(pCVar2,&pDVar7->catalog);
      StatementProperties::RegisterDBModify(this_00,catalog_00,this->context);
      goto LAB_006f5db7;
    }
    if (bVar1 != 5) goto LAB_006f5d7b;
  }
  else {
LAB_006f5d7b:
    if (bVar1 != 0x47) {
      this_03 = (BinderException *)__cxa_allocate_exception(0x10);
      local_b8._0_8_ = local_b8 + 0x10;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_b8,"Unknown catalog type for drop statement: \'%s\'","");
      pDVar7 = unique_ptr<duckdb::DropInfo,_std::default_delete<duckdb::DropInfo>,_true>::operator->
                         (this_04);
      CatalogTypeToString_abi_cxx11_
                (&local_50,(duckdb *)(ulong)(byte)(pDVar7->super_ParseInfo).field_0x9,type);
      BinderException::BinderException<std::__cxx11::string>(this_03,(string *)local_b8,&local_50);
      __cxa_throw(this_03,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
    }
  }
  this_00->requires_valid_transaction = false;
LAB_006f5db7:
  this_01.super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl =
       (_Head_base<0UL,_duckdb::LogicalOperator_*,_false>)operator_new(0x70);
  _Var3._M_head_impl =
       (this_04->super_unique_ptr<duckdb::DropInfo,_std::default_delete<duckdb::DropInfo>_>)._M_t.
       super___uniq_ptr_impl<duckdb::DropInfo,_std::default_delete<duckdb::DropInfo>_>._M_t.
       super__Tuple_impl<0UL,_duckdb::DropInfo_*,_std::default_delete<duckdb::DropInfo>_>.
       super__Head_base<0UL,_duckdb::DropInfo_*,_false>._M_head_impl;
  (this_04->super_unique_ptr<duckdb::DropInfo,_std::default_delete<duckdb::DropInfo>_>)._M_t.
  super___uniq_ptr_impl<duckdb::DropInfo,_std::default_delete<duckdb::DropInfo>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::DropInfo_*,_std::default_delete<duckdb::DropInfo>_>.
  super__Head_base<0UL,_duckdb::DropInfo_*,_false>._M_head_impl = (DropInfo *)0x0;
  LogicalOperator::LogicalOperator
            ((LogicalOperator *)
             this_01.super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl,
             LOGICAL_DROP);
  *(undefined ***)this_01.super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl =
       &PTR__LogicalSimple_019ad1e8;
  ((LogicalOperator *)
  ((long)this_01.super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl + 0x68))->
  _vptr_LogicalOperator = (_func_int **)_Var3._M_head_impl;
  _Var4.super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl =
       (__return_storage_ptr__->plan).
       super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>._M_t
       .
       super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
       .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>;
  (__return_storage_ptr__->plan).
  super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>._M_t.
  super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>._M_t
  .super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>.
  super__Head_base<0UL,_duckdb::LogicalOperator_*,_false> =
       this_01.super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl;
  if (_Var4.super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl !=
      (LogicalOperator *)0x0) {
    (**(code **)(*(long *)_Var4.super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl
                + 8))();
  }
  local_b8._0_8_ = local_b8 + 0x10;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)local_b8,"Success","");
  __l._M_len = 1;
  __l._M_array = (iterator)local_b8;
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&local_d8,__l,(allocator_type *)&local_e0);
  local_98._0_8_ =
       (__return_storage_ptr__->names).
       super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       .
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_98._8_8_ =
       (__return_storage_ptr__->names).
       super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       .
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_98._16_8_ =
       (__return_storage_ptr__->names).
       super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       .
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (__return_storage_ptr__->names).
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)local_d8._0_8_;
  (__return_storage_ptr__->names).
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (pointer)local_d8.type_info_.internal.
                super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  (__return_storage_ptr__->names).
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)local_d8.type_info_.internal.
                super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                _M_pi;
  local_d8._0_8_ = (Catalog *)0x0;
  local_d8.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)0x0;
  local_d8.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_98);
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_d8);
  if ((undefined1 *)local_b8._0_8_ != local_b8 + 0x10) {
    operator_delete((void *)local_b8._0_8_);
  }
  LogicalType::LogicalType(&local_d8,BOOLEAN);
  __l_00._M_len = 1;
  __l_00._M_array = &local_d8;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)local_98,__l_00,
             (allocator_type *)&local_e0);
  local_b8._0_8_ =
       (__return_storage_ptr__->types).
       super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
       super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_b8._8_8_ =
       (__return_storage_ptr__->types).
       super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
       super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_b8._16_8_ =
       (__return_storage_ptr__->types).
       super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
       super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  (__return_storage_ptr__->types).
  super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)local_98._0_8_;
  (__return_storage_ptr__->types).
  super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)local_98._8_8_;
  (__return_storage_ptr__->types).
  super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)local_98._16_8_;
  local_98._0_8_ = (pointer)0x0;
  local_98._8_8_ = (pointer)0x0;
  local_98._16_8_ = (pointer)0x0;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)local_b8);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)local_98);
  LogicalType::~LogicalType(&local_d8);
  this_00->allow_stream_result = false;
  this_00->return_type = NOTHING;
  return __return_storage_ptr__;
}

Assistant:

BoundStatement Binder::Bind(DropStatement &stmt) {
	BoundStatement result;

	auto &properties = GetStatementProperties();
	switch (stmt.info->type) {
	case CatalogType::PREPARED_STATEMENT:
		// dropping prepared statements is always possible
		// it also does not require a valid transaction
		properties.requires_valid_transaction = false;
		break;
	case CatalogType::SCHEMA_ENTRY: {
		// dropping a schema is never read-only because there are no temporary schemas
		auto &catalog = Catalog::GetCatalog(context, stmt.info->catalog);
		properties.RegisterDBModify(catalog, context);
		break;
	}
	case CatalogType::VIEW_ENTRY:
	case CatalogType::SEQUENCE_ENTRY:
	case CatalogType::MACRO_ENTRY:
	case CatalogType::TABLE_MACRO_ENTRY:
	case CatalogType::INDEX_ENTRY:
	case CatalogType::TABLE_ENTRY:
	case CatalogType::TYPE_ENTRY: {
		BindSchemaOrCatalog(stmt.info->catalog, stmt.info->schema);
		auto catalog = Catalog::GetCatalogEntry(context, stmt.info->catalog);
		if (catalog) {
			// mark catalog as accessed
			properties.RegisterDBRead(*catalog, context);
		}
		EntryLookupInfo entry_lookup(stmt.info->type, stmt.info->name);
		auto entry = Catalog::GetEntry(context, stmt.info->catalog, stmt.info->schema, entry_lookup,
		                               OnEntryNotFound::RETURN_NULL);
		if (!entry) {
			break;
		}
		if (entry->internal) {
			throw CatalogException("Cannot drop internal catalog entry \"%s\"!", entry->name);
		}
		stmt.info->catalog = entry->ParentCatalog().GetName();
		if (!entry->temporary) {
			// we can only drop temporary schema entries in read-only mode
			properties.RegisterDBModify(entry->ParentCatalog(), context);
		}
		stmt.info->schema = entry->ParentSchema().name;
		break;
	}
	case CatalogType::SECRET_ENTRY: {
		//! Secrets are stored in the secret manager; they can always be dropped
		properties.requires_valid_transaction = false;
		break;
	}
	default:
		throw BinderException("Unknown catalog type for drop statement: '%s'", CatalogTypeToString(stmt.info->type));
	}
	result.plan = make_uniq<LogicalSimple>(LogicalOperatorType::LOGICAL_DROP, std::move(stmt.info));
	result.names = {"Success"};
	result.types = {LogicalType::BOOLEAN};

	properties.allow_stream_result = false;
	properties.return_type = StatementReturnType::NOTHING;
	return result;
}